

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-dependency.t.cpp
# Opt level: O3

bool __thiscall dynamicgraph::TimeDependency<int>::needUpdate(TimeDependency<int> *this,int *t1)

{
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  int *piVar6;
  undefined4 extraout_var_00;
  uint uVar7;
  
  uVar7 = 1;
  if (((this->leader->ready == false) && (this->lastAskForUpdate == 0)) &&
     (this->dependencyType != ALWAYS_READY)) {
    if ((this->dependencyType == TIME_DEPENDENT) &&
       (iVar1 = *t1, iVar5 = (*this->leader->_vptr_SignalBase[2])(),
       iVar1 < this->periodTime + *(int *)CONCAT44(extraout_var,iVar5))) {
      uVar7 = 0;
    }
    else {
      uVar7 = (uint)this->updateFromAllChildren;
      for (p_Var2 = (this->dependencies).
                    super__List_base<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                    ._M_impl._M_node.super__List_node_base._M_next;
          p_Var2 != (_List_node_base *)&this->dependencies; p_Var2 = p_Var2->_M_next) {
        p_Var3 = p_Var2[1]._M_next;
        piVar6 = (int *)(**(code **)((long)p_Var3->_M_next + 0x10))(p_Var3);
        iVar1 = *piVar6;
        iVar5 = (*this->leader->_vptr_SignalBase[2])();
        if ((*(int *)CONCAT44(extraout_var_00,iVar5) < iVar1) ||
           (cVar4 = (**(code **)((long)p_Var3->_M_next + 0x48))(p_Var3,t1), cVar4 != '\0')) {
          if (this->updateFromAllChildren == false) {
            uVar7 = 1;
            break;
          }
        }
        else if (this->updateFromAllChildren != false) {
          uVar7 = 0;
          break;
        }
      }
      this->lastAskForUpdate = uVar7;
    }
  }
  return SUB41(uVar7,0);
}

Assistant:

bool TimeDependency<Time>::needUpdate(const Time &t1) const {
  dgTDEBUG(15) << "# In {" << leader.getName() << " : (" << leader.getReady()
               << ") " << t1 << " >? " << leader.getTime() << std::endl;

  if (leader.getReady()) {
    dgTDEBUGOUT(15);
    return true;
  }
  if (lastAskForUpdate) {
    dgTDEBUGOUT(15);
    return true;
  }

  switch (dependencyType) {
    case ALWAYS_READY: {
      dgTDEBUGOUT(15);
      return true;
    }
    case BOOL_DEPENDENT:
      break;
    case TIME_DEPENDENT: {
      if (t1 < leader.getTime() + periodTime) {
        dgTDEBUGOUT(15);
        return false;
      }
      break;
    }
  };

  bool res = updateFromAllChildren;
  const typename Dependencies::const_iterator itend = dependencies.end();
  for (typename Dependencies::const_iterator it = dependencies.begin();
       it != itend; ++it) {
    const SignalBase<Time> &sig = **it;
    dgTDEBUG(15) << "Ask update for " << sig << std::endl;

    if ((sig.getTime() > leader.getTime()) || (sig.needUpdate(t1))) {
      if (updateFromAllChildren)
        continue;
      else {
        res = true;
        break;
      }
    } else {
      if (updateFromAllChildren) {
        res = false;
        break;
      } else
        continue;
    }
  }
  lastAskForUpdate = res;

  dgTDEBUGOUT(15);
  return res;
}